

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Spinner.H
# Opt level: O3

void __thiscall Fl_Spinner::update(Fl_Spinner *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char local_158 [8];
  char s [255];
  char temp [64];
  
  pcVar1 = this->format_;
  if (((*pcVar1 == '%') && (pcVar1[1] == '.')) && (pcVar1[2] == '*')) {
    pcVar1 = s + 0xf8;
    sprintf(pcVar1,"%.12f",this->step_);
    pcVar3 = s + 0xf6;
    do {
      pcVar2 = pcVar3 + 2;
      pcVar3 = pcVar3 + 1;
    } while (*pcVar2 != '\0');
    do {
      pcVar2 = pcVar3;
      if (pcVar2 <= pcVar1) {
        uVar4 = 0;
        goto LAB_0017439b;
      }
      pcVar3 = pcVar2 + -1;
    } while (*pcVar2 == '0');
    uVar4 = 0;
    do {
      if (9 < (byte)(*pcVar2 - 0x30U)) break;
      pcVar2 = pcVar2 + -1;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (pcVar1 < pcVar2);
LAB_0017439b:
    sprintf(local_158,this->format_,this->value_,uVar4);
  }
  else {
    sprintf(local_158,pcVar1,this->value_);
  }
  Fl_Input_::value(&(this->input_).super_Fl_Input_,local_158);
  return;
}

Assistant:

void		update() {
		  char s[255];		// Value string

		  if (format_[0]=='%'&&format_[1]=='.'&&format_[2]=='*') {  // precision argument
		    // this code block is a simplified version of
		    // Fl_Valuator::format() and works well (but looks ugly)
		    int c = 0;
		    char temp[64], *sp = temp;
		    sprintf(temp, "%.12f", step_);
		    while (*sp) sp++;
		    sp--;
		    while (sp>temp && *sp=='0') sp--;
		    while (sp>temp && (*sp>='0' && *sp<='9')) { sp--; c++; }
		    sprintf(s, format_, c, value_);
		  } else {
		    sprintf(s, format_, value_);
		  }
		  input_.value(s);
		}